

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<float>,duckdb::MaxOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  float *left;
  float *right;
  bool bVar3;
  idx_t iVar4;
  
  if (count != 0) {
    pdVar1 = source->data;
    pdVar2 = target->data;
    iVar4 = 0;
    do {
      left = *(float **)(pdVar1 + iVar4 * 8);
      if (*(char *)(left + 1) == '\x01') {
        right = *(float **)(pdVar2 + iVar4 * 8);
        if (*(char *)(right + 1) == '\0') {
          *(undefined8 *)right = *(undefined8 *)left;
        }
        else {
          bVar3 = GreaterThan::Operation<float>(left,right);
          if (bVar3) {
            *right = *left;
          }
        }
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}